

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O0

void __thiscall PolygonTriangulation::init_permutation_table(PolygonTriangulation *this)

{
  uint32_t uVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_14;
  uint i;
  PolygonTriangulation *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->permutation_,(ulong)this->num_segments_);
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->permutation_);
    if (sVar2 <= local_14) break;
    uVar1 = this->num_segments_;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->permutation_,(ulong)local_14);
    *pvVar3 = (uVar1 - local_14) - 1;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void PolygonTriangulation::init_permutation_table()
{
  permutation_.resize(num_segments_);
  for (auto i = 0u; i < permutation_.size(); ++i) {
    permutation_[i] = num_segments_-i-1;
  }
#if 0
  const auto seed = std::chrono::system_clock::now().time_since_epoch().count();
  fprintf(stderr, "seed used : %lu\n", seed);
  std::shuffle(permutation_.begin(), permutation_.end(), std::default_random_engine(seed));
#endif
}